

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_reader.cc
# Opt level: O0

Status * __thiscall draco::PlyReader::Read(PlyReader *this,DecoderBuffer *buffer)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  size_type sVar5;
  const_reference pvVar6;
  long in_RSI;
  Status *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  string version;
  string format;
  string value;
  Status *_local_status;
  char *in_stack_fffffffffffffe28;
  Code CVar7;
  undefined5 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe35;
  undefined1 in_stack_fffffffffffffe36;
  undefined1 in_stack_fffffffffffffe37;
  DecoderBuffer *in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  PlyReader *in_stack_fffffffffffffe48;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  char *in_stack_fffffffffffffe68;
  allocator<char> *__s;
  undefined7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  allocator<char> local_161;
  string local_160 [38];
  byte local_13a;
  allocator<char> local_139;
  string local_138 [24];
  string *in_stack_fffffffffffffee0;
  PlyReader *in_stack_fffffffffffffee8;
  string local_110 [16];
  DecoderBuffer *in_stack_ffffffffffffff00;
  PlyReader *in_stack_ffffffffffffff08;
  allocator<char> local_e9;
  string local_e8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  string local_b0 [32];
  string local_90 [32];
  uint local_70;
  allocator<char> local_69;
  string local_68 [48];
  string local_38 [56];
  
  std::__cxx11::string::string(local_38);
  bVar1 = parser::ParseString(in_stack_fffffffffffffe38,
                              (string *)
                              CONCAT17(in_stack_fffffffffffffe37,
                                       CONCAT16(in_stack_fffffffffffffe36,
                                                CONCAT15(in_stack_fffffffffffffe35,
                                                         in_stack_fffffffffffffe30))));
  if ((!bVar1) ||
     (in_stack_fffffffffffffe77 =
           std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffffe37,
                                    CONCAT16(in_stack_fffffffffffffe36,
                                             CONCAT15(in_stack_fffffffffffffe35,
                                                      in_stack_fffffffffffffe30))),
                           in_stack_fffffffffffffe28), (bool)in_stack_fffffffffffffe77)) {
    CVar7 = (Code)((ulong)in_stack_fffffffffffffe28 >> 0x20);
    __s = &local_69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),(char *)__s,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
    Status::Status((Status *)
                   CONCAT17(in_stack_fffffffffffffe37,
                            CONCAT16(in_stack_fffffffffffffe36,
                                     CONCAT15(in_stack_fffffffffffffe35,in_stack_fffffffffffffe30)))
                   ,CVar7,(string *)0x142fa8);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator(&local_69);
    local_70 = 1;
    goto LAB_001435dd;
  }
  parser::SkipLine((DecoderBuffer *)0x143043);
  parser::ParseLine((DecoderBuffer *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                    (string *)in_stack_fffffffffffffe38);
  std::__cxx11::string::string(local_90);
  std::__cxx11::string::string(local_b0);
  SplitWords(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&local_c8);
  if (sVar5 < 3) {
LAB_00143158:
    CVar7 = (Code)((ulong)in_stack_fffffffffffffe28 >> 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
               in_stack_fffffffffffffe68,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
    Status::Status((Status *)
                   CONCAT17(in_stack_fffffffffffffe37,
                            CONCAT16(in_stack_fffffffffffffe36,
                                     CONCAT15(in_stack_fffffffffffffe35,in_stack_fffffffffffffe30)))
                   ,CVar7,(string *)0x14319c);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator(&local_e9);
    local_70 = 1;
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_c8,0);
    in_stack_fffffffffffffe67 =
         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffffe37,
                                  CONCAT16(in_stack_fffffffffffffe36,
                                           CONCAT15(in_stack_fffffffffffffe35,
                                                    in_stack_fffffffffffffe30))),
                         in_stack_fffffffffffffe28);
    if (!(bool)in_stack_fffffffffffffe67) goto LAB_00143158;
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_c8,1);
    std::__cxx11::string::operator=(local_90,(string *)pvVar6);
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_c8,2);
    std::__cxx11::string::operator=(local_b0,(string *)pvVar6);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffe37,
                                     CONCAT16(in_stack_fffffffffffffe36,
                                              CONCAT15(in_stack_fffffffffffffe35,
                                                       in_stack_fffffffffffffe30))),
                            in_stack_fffffffffffffe28);
    if (bVar1) {
      std::allocator<char>::allocator();
      CVar7 = (Code)((ulong)in_stack_fffffffffffffe28 >> 0x20);
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                 in_stack_fffffffffffffe68,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
      Status::Status((Status *)
                     CONCAT17(in_stack_fffffffffffffe37,
                              CONCAT16(in_stack_fffffffffffffe36,
                                       CONCAT15(in_stack_fffffffffffffe35,in_stack_fffffffffffffe30)
                                      )),CVar7,(string *)0x14327c);
      std::__cxx11::string::~string(local_110);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffeef);
      local_70 = 1;
    }
    else {
      in_stack_fffffffffffffe47 =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffffe37,
                                    CONCAT16(in_stack_fffffffffffffe36,
                                             CONCAT15(in_stack_fffffffffffffe35,
                                                      in_stack_fffffffffffffe30))),
                           in_stack_fffffffffffffe28);
      if ((bool)in_stack_fffffffffffffe47) {
        std::allocator<char>::allocator();
        CVar7 = (Code)((ulong)in_stack_fffffffffffffe28 >> 0x20);
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                   in_stack_fffffffffffffe68,
                   (allocator<char> *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60))
        ;
        Status::Status((Status *)
                       CONCAT17(in_stack_fffffffffffffe37,
                                CONCAT16(in_stack_fffffffffffffe36,
                                         CONCAT15(in_stack_fffffffffffffe35,
                                                  in_stack_fffffffffffffe30))),CVar7,
                       (string *)0x14335c);
        std::__cxx11::string::~string(local_138);
        std::allocator<char>::~allocator(&local_139);
        local_70 = 1;
      }
      else {
        uVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffffe37,
                                          CONCAT16(in_stack_fffffffffffffe36,
                                                   CONCAT15(in_stack_fffffffffffffe35,
                                                            in_stack_fffffffffffffe30))),
                                in_stack_fffffffffffffe28);
        if ((bool)uVar2) {
          *(undefined4 *)(in_RSI + 0x48) = 1;
        }
        else {
          *(undefined4 *)(in_RSI + 0x48) = 0;
        }
        local_13a = 0;
        ParseHeader(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
        uVar3 = Status::ok(in_RDI);
        if (!(bool)uVar3) {
          local_13a = 1;
        }
        local_70 = (uint)!(bool)uVar3;
        if ((local_13a & 1) == 0) {
          Status::~Status((Status *)0x1434a1);
        }
        if (local_70 == 0) {
          uVar4 = ParsePropertiesData(in_stack_fffffffffffffe48,
                                      (DecoderBuffer *)
                                      CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40))
          ;
          if ((bool)uVar4) {
            OkStatus();
            local_70 = 1;
          }
          else {
            CVar7 = (Code)((ulong)&local_161 >> 0x20);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                       in_stack_fffffffffffffe68,
                       (allocator<char> *)
                       CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
            Status::Status((Status *)
                           CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,in_stack_fffffffffffffe30)))
                           ,CVar7,(string *)0x143511);
            std::__cxx11::string::~string(local_160);
            std::allocator<char>::~allocator(&local_161);
            local_70 = 1;
          }
        }
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_90);
LAB_001435dd:
  std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

Status PlyReader::Read(DecoderBuffer *buffer) {
  std::string value;
  // The first line needs to by "ply".
  if (!parser::ParseString(buffer, &value) || value != "ply") {
    return Status(Status::INVALID_PARAMETER, "Not a valid ply file");
  }
  parser::SkipLine(buffer);

  // The second line needs to be the format of the ply file.
  parser::ParseLine(buffer, &value);
  std::string format, version;
  const std::vector<std::string> words = SplitWords(value);
  if (words.size() >= 3 && words[0] == "format") {
    format = words[1];
    version = words[2];
  } else {
    return Status(Status::INVALID_PARAMETER, "Missing or wrong format line");
  }
  if (version != "1.0") {
    return Status(Status::UNSUPPORTED_VERSION, "Unsupported PLY version");
  }
  if (format == "binary_big_endian") {
    return Status(Status::UNSUPPORTED_VERSION,
                  "Unsupported format. Currently we support only ascii and"
                  " binary_little_endian format.");
  }
  if (format == "ascii") {
    format_ = kAscii;
  } else {
    format_ = kLittleEndian;
  }
  DRACO_RETURN_IF_ERROR(ParseHeader(buffer));
  if (!ParsePropertiesData(buffer)) {
    return Status(Status::INVALID_PARAMETER, "Couldn't parse properties");
  }
  return OkStatus();
}